

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

void history_def_clear(void *p,HistEvent_conflict *ev)

{
  history_t *h;
  HistEvent_conflict *ev_local;
  void *p_local;
  
  while (*(void **)((long)p + 0x20) != p) {
    history_def_delete((history_t *)p,ev,*(hentry_t_conflict **)((long)p + 0x20));
  }
  *(void **)((long)p + 0x28) = p;
  *(undefined4 *)((long)p + 0x38) = 0;
  *(undefined4 *)((long)p + 0x34) = 0;
  return;
}

Assistant:

static void
history_def_clear(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	while (h->list.prev != &h->list)
		history_def_delete(h, ev, h->list.prev);
	h->cursor = &h->list;
	h->eventid = 0;
	h->cur = 0;
}